

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int rewrite_insn(gen_ctx_t gen_ctx,MIR_insn_t insn,MIR_reg_t base_reg,rewrite_data *data)

{
  char cVar1;
  MIR_context_t ctx_00;
  bb_insn_t_conflict pbVar2;
  MIR_op_t op1;
  MIR_type_t MVar3;
  MIR_reg_t MVar4;
  int iVar5;
  MIR_op_t *pMVar6;
  MIR_op_t *__src;
  bb_insn_t_conflict pbVar7;
  MIR_insn_t_conflict insn_00;
  MIR_reg_t local_170;
  MIR_reg_t local_16c;
  MIR_insn_t nop;
  bb_insn_t_conflict bb_insn_1;
  MIR_reg_t loc_1;
  int nregs;
  MIR_reg_t loc;
  bitmap_iterator_t bi;
  bb_insn_t_conflict bb_insn;
  size_t nel;
  MIR_reg_t local_118;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  int niter;
  int other_mem_op_num;
  int in_mem_op_num;
  int out_mem_op_num;
  int rld_in_num;
  int addr_reload_p;
  int call_p;
  int out_p;
  MIR_reg_t reg;
  MIR_reg_t hard_reg;
  MIR_op_mode_t data_mode;
  MIR_op_t out_op;
  MIR_op_t in_op;
  MIR_op_t mem_op;
  MIR_op_t *op;
  size_t i;
  size_t nops;
  MIR_type_t type;
  MIR_context_t ctx;
  rewrite_data *data_local;
  MIR_reg_t base_reg_local;
  MIR_insn_t insn_local;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  MIR_new_int_op((MIR_op_t *)((long)&out_op.u + 0x18),ctx_00,0);
  MIR_new_int_op((MIR_op_t *)&hard_reg,ctx_00,0);
  pMVar6 = (MIR_op_t *)MIR_insn_nops(ctx_00,insn);
  niter = -1;
  other_mem_op_num = -1;
  in_mem_op_num = 0;
  for (early_clobbered_hard_reg2 = 0; (int)early_clobbered_hard_reg2 < 2;
      early_clobbered_hard_reg2 = early_clobbered_hard_reg2 + 1) {
    for (op = (MIR_op_t *)0x0; op < pMVar6; op = (MIR_op_t *)((long)&op->data + 1)) {
      reg = MIR_insn_op_mode(ctx_00,insn,(size_t)op,&addr_reload_p);
      if (((early_clobbered_hard_reg2 != 0) ||
          ((addr_reload_p != 0 && ((*(ushort *)&insn->ops[(long)op].field_0x8 & 0xff) != 0xb)))) &&
         ((early_clobbered_hard_reg2 != 1 ||
          ((addr_reload_p == 0 || ((*(ushort *)&insn->ops[(long)op].field_0x8 & 0xff) == 0xb)))))) {
        cVar1 = insn->ops[(long)op].field_0x8;
        if (cVar1 == '\x02') {
          if (insn->ops[(long)op].u.reg < 0x22) {
            bitmap_set_bit_p(gen_ctx->func_used_hard_regs,(ulong)insn->ops[(long)op].u.reg);
            if (data != (rewrite_data *)0x0) {
              update_live(insn->ops[(long)op].u.reg,addr_reload_p,data->live);
            }
          }
          else {
            if (((addr_reload_p == 0) &&
                (MVar4 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,
                                           (ulong)insn->ops[(long)op].u.reg), 0x21 < MVar4)) &&
               (MVar3 = mode2type(reg), MVar3 == MIR_T_I64)) {
              in_mem_op_num = in_mem_op_num + 1;
            }
            if (data != (rewrite_data *)0x0) {
              update_live(insn->ops[(long)op].u.reg,addr_reload_p,data->live);
              iVar5 = bitmap_clear_bit_p(data->regs_to_save,(ulong)insn->ops[(long)op].u.reg);
              if (iVar5 != 0) {
                spill_restore_reg(gen_ctx,insn->ops[(long)op].u.reg,base_reg,insn,1,0);
              }
            }
          }
        }
        else if (cVar1 == '\v') {
          if (insn->ops[(long)op].u.mem.base < 0x22) {
            bitmap_set_bit_p(gen_ctx->func_used_hard_regs,(ulong)insn->ops[(long)op].u.mem.base);
          }
          if (insn->ops[(long)op].u.mem.index < 0x22) {
            bitmap_set_bit_p(gen_ctx->func_used_hard_regs,(ulong)insn->ops[(long)op].u.mem.index);
          }
          if ((((insn->ops[(long)op].u.mem.base != 0xffffffff) &&
               (insn->ops[(long)op].u.mem.index != 0xffffffff)) &&
              ((0x21 < insn->ops[(long)op].u.mem.base &&
               ((0x21 < insn->ops[(long)op].u.mem.index &&
                (MVar4 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,
                                           (ulong)insn->ops[(long)op].u.mem.base), 0x21 < MVar4)))))
              ) && (MVar4 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,
                                              (ulong)insn->ops[(long)op].u.mem.index), 0x21 < MVar4)
             ) {
            early_clobbered_hard_reg1 = 0xffffffff;
            iVar5 = (int)op;
            if (addr_reload_p == 0) {
              if (-1 < niter) {
                __assert_fail("in_mem_op_num < 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1f5f,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
              niter = iVar5;
              if (-1 < other_mem_op_num) {
                early_clobbered_hard_reg1 = other_mem_op_num;
              }
            }
            else {
              if (-1 < other_mem_op_num) {
                __assert_fail("out_mem_op_num < 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1f5b,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
              other_mem_op_num = iVar5;
              if (-1 < niter) {
                early_clobbered_hard_reg1 = niter;
              }
            }
            if ((((int)early_clobbered_hard_reg1 < 0) ||
                (insn->ops[(long)op].u.mem.base !=
                 insn->ops[(int)early_clobbered_hard_reg1].u.mem.base)) ||
               (insn->ops[(long)op].u.mem.index !=
                insn->ops[(int)early_clobbered_hard_reg1].u.mem.index)) {
              in_mem_op_num = in_mem_op_num + 2;
            }
          }
          if (data != (rewrite_data *)0x0) {
            if (((insn->ops[(long)op].u.mem.base != 0xffffffff) &&
                (update_live(insn->ops[(long)op].u.mem.base,0,data->live),
                0x21 < insn->ops[(long)op].u.mem.base)) &&
               (iVar5 = bitmap_clear_bit_p(data->regs_to_save,(ulong)insn->ops[(long)op].u.mem.base)
               , iVar5 != 0)) {
              spill_restore_reg(gen_ctx,insn->ops[(long)op].u.mem.base,base_reg,insn,1,0);
            }
            if (((insn->ops[(long)op].u.mem.index != 0xffffffff) &&
                (update_live(insn->ops[(long)op].u.mem.index,0,data->live),
                0x21 < insn->ops[(long)op].u.mem.index)) &&
               (iVar5 = bitmap_clear_bit_p(data->regs_to_save,(ulong)insn->ops[(long)op].u.mem.index
                                          ), iVar5 != 0)) {
              spill_restore_reg(gen_ctx,insn->ops[(long)op].u.mem.index,base_reg,insn,1,0);
            }
          }
        }
      }
    }
    if ((data != (rewrite_data *)0x0) && (early_clobbered_hard_reg2 == 0)) {
      target_get_early_clobbered_hard_regs(insn,&local_118,(MIR_reg_t *)((long)&nel + 4));
      if (local_118 != 0xffffffff) {
        update_live(local_118,1,data->live);
      }
      if (nel._4_4_ != 0xffffffff) {
        update_live(nel._4_4_,1,data->live);
      }
      iVar5 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&insn->field_0x18);
      if (iVar5 != 0) {
        bi.nbit = (size_t)insn->data;
        bitmap_iterator_init((bitmap_iterator_t *)&nregs,gen_ctx->call_used_hard_regs[0x12]);
        while (iVar5 = bitmap_iterator_next((bitmap_iterator_t *)&nregs,(size_t *)&bb_insn),
              iVar5 != 0) {
          update_live((MIR_reg_t)bb_insn,1,data->live);
        }
        bitmap_iterator_init((bitmap_iterator_t *)&nregs,*(bitmap_t *)(bi.nbit + 0x48));
        while (iVar5 = bitmap_iterator_next((bitmap_iterator_t *)&nregs,(size_t *)&bb_insn),
              iVar5 != 0) {
          update_live((MIR_reg_t)bb_insn,0,data->live);
        }
        bitmap_iterator_init((bitmap_iterator_t *)&nregs,data->live);
        while (iVar5 = bitmap_iterator_next((bitmap_iterator_t *)&nregs,(size_t *)&bb_insn),
              iVar5 != 0) {
          if ((bb_insn_t_conflict)0x21 < bb_insn) {
            call_p = (int)bb_insn;
            iVar5 = bitmap_bit_p(data->bb->gen,(ulong)bb_insn & 0xffffffff);
            if ((iVar5 == 0) &&
               (MVar4 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,(ulong)(uint)call_p),
               MVar4 < 0x22)) {
              MVar3 = MIR_reg_type(gen_ctx->ctx,call_p - 0x21,(gen_ctx->curr_func_item->u).func);
              iVar5 = target_locs_num(MVar4,MVar3);
              iVar5 = hreg_in_bitmap_p(MVar4,MVar3,iVar5,gen_ctx->call_used_hard_regs[0x12]);
              if ((iVar5 != 0) &&
                 (iVar5 = bitmap_set_bit_p(data->regs_to_save,(ulong)(uint)call_p), iVar5 != 0)) {
                spill_restore_reg(gen_ctx,call_p,base_reg,insn,1,1);
              }
            }
          }
        }
      }
    }
  }
  out_mem_op_num = (int)(2 < in_mem_op_num);
  gen_ctx->ra_ctx->in_reloads_num = 0;
  gen_ctx->ra_ctx->out_reloads_num = 0;
  if (out_mem_op_num != 0) {
    reload_addr(gen_ctx,insn,niter,other_mem_op_num,base_reg);
    get_reload_hreg(gen_ctx,0xffffffff,6,0);
  }
  iVar5 = MIR_addr_code_p((MIR_insn_code_t)*(undefined8 *)&insn->field_0x18);
  if (iVar5 != 0) {
    transform_addr(gen_ctx,insn,base_reg);
  }
  rld_in_num = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&insn->field_0x18);
  op = (MIR_op_t *)0x0;
  do {
    if (pMVar6 <= op) {
      iVar5 = move_code_p((MIR_insn_code_t)*(undefined8 *)&insn->field_0x18);
      if ((iVar5 == 0) ||
         (op1.data = insn->ops[0].data, op1._8_8_ = *(undefined8 *)&insn->ops[0].field_0x8,
         op1.u = insn->ops[0].u, iVar5 = MIR_op_eq_p(ctx_00,op1,*(MIR_op_t *)(insn + 1)), iVar5 == 0
         )) {
        gen_ctx_local._4_4_ = 0;
      }
      else {
        if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fprintf((FILE *)gen_ctx->debug_file,"Deleting noop move ");
          MIR_output_insn(ctx_00,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,0);
          fprintf((FILE *)gen_ctx->debug_file," which was ");
          memcpy(insn->ops,&hard_reg,0x30);
          memcpy(insn + 1,(void *)((long)&out_op.u + 0x18),0x30);
          MIR_output_insn(ctx_00,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,1);
        }
        if ((((gen_ctx->optimize_level != 0) &&
             (pbVar2 = (bb_insn_t_conflict)insn->data, pbVar2 != (bb_insn_t_conflict)0x0)) &&
            (pbVar7 = DLIST_bb_insn_t_head(&pbVar2->bb->bb_insns), pbVar7 == pbVar2)) &&
           (pbVar7 = DLIST_bb_insn_t_tail(&pbVar2->bb->bb_insns), pbVar7 == pbVar2)) {
          insn_00 = MIR_new_insn_arr(gen_ctx->ctx,MIR_USE,0,(MIR_op_t *)0x0);
          MIR_insert_insn_before(gen_ctx->ctx,gen_ctx->curr_func_item,pbVar2->insn,insn_00);
          add_new_bb_insn(gen_ctx,insn_00,pbVar2->bb,0);
        }
        gen_delete_insn(gen_ctx,insn);
        gen_ctx_local._4_4_ = 1;
      }
      return gen_ctx_local._4_4_;
    }
    __src = insn->ops + (long)op;
    reg = MIR_insn_op_mode(ctx_00,insn,(size_t)op,&addr_reload_p);
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      if (addr_reload_p == 0) {
        memcpy((void *)((long)&out_op.u + 0x18),__src,0x30);
      }
      else {
        memcpy(&hard_reg,__src,0x30);
      }
    }
    if (__src->field_0x8 == '\x02') {
      if (0x21 < (__src->u).reg) {
        if (reg == 2) {
          if (((int)*(undefined8 *)&insn->field_0x18 != 0xb9) &&
             ((iVar5 = MIR_addr_code_p((MIR_insn_code_t)*(undefined8 *)&insn->field_0x18),
              iVar5 == 0 || (op != (MIR_op_t *)&DAT_00000001)))) {
            __assert_fail("insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1fb5,
                          "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                         );
          }
          MVar3 = MIR_reg_type(ctx_00,(__src->u).reg - 0x21,(gen_ctx->curr_func_item->u).func);
          if (MVar3 == MIR_T_F) {
            local_16c = 5;
          }
          else {
            if (MVar3 == MIR_T_D) {
              local_170 = 6;
            }
            else {
              local_170 = 3;
              if (MVar3 == MIR_T_LD) {
                local_170 = 7;
              }
            }
            local_16c = local_170;
          }
          reg = local_16c;
        }
        MVar4 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,(ulong)(__src->u).reg);
        iVar5 = MIR_addr_code_p((MIR_insn_code_t)*(undefined8 *)&insn->field_0x18);
        if ((((iVar5 != 0) || (op != (MIR_op_t *)0x0)) || (MVar4 < 0x22)) ||
           (iVar5 = try_spilled_reg_mem(gen_ctx,insn,0,MVar4,base_reg), iVar5 == 0)) {
          out_p = change_reg(gen_ctx,(MIR_op_t *)((long)&in_op.u + 0x18),(__src->u).reg,base_reg,reg
                             ,insn,addr_reload_p);
          if (out_p == 0xffffffff) {
            memcpy(__src,(void *)((long)&in_op.u + 0x18),0x30);
          }
          else {
            (__src->u).reg = out_p;
          }
        }
      }
    }
    else if ((__src->field_0x8 == '\v') &&
            ((rld_in_num == 0 || (iVar5 = MIR_blk_type_p((uint)*(byte *)&__src->u), iVar5 == 0)))) {
      if ((0x21 < (__src->u).mem.base) && ((__src->u).mem.base != 0xffffffff)) {
        MVar4 = change_reg(gen_ctx,(MIR_op_t *)((long)&in_op.u + 0x18),(__src->u).mem.base,base_reg,
                           MIR_OP_INT,insn,0);
        (__src->u).mem.base = MVar4;
        if ((__src->u).mem.base == 0xffffffff) {
          __assert_fail("op->u.var_mem.base != (4294967295U)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1fcc,
                        "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)")
          ;
        }
      }
      if ((0x21 < (__src->u).mem.index) && ((__src->u).mem.index != 0xffffffff)) {
        MVar4 = change_reg(gen_ctx,(MIR_op_t *)((long)&in_op.u + 0x18),(__src->u).mem.index,base_reg
                           ,MIR_OP_INT,insn,0);
        (__src->u).mem.index = MVar4;
        if ((__src->u).mem.index == 0xffffffff) {
          __assert_fail("op->u.var_mem.index != (4294967295U)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1fd1,
                        "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)")
          ;
        }
      }
    }
    op = (MIR_op_t *)((long)&op->data + 1);
  } while( true );
}

Assistant:

static int rewrite_insn (gen_ctx_t gen_ctx, MIR_insn_t insn, MIR_reg_t base_reg,
                         struct rewrite_data *data) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_type_t type;
  size_t nops, i;
  MIR_op_t *op, mem_op;
#if !MIR_NO_GEN_DEBUG
  MIR_op_t in_op = MIR_new_int_op (ctx, 0),
           out_op = MIR_new_int_op (ctx, 0); /* To remove unitilized warning */
#endif
  MIR_op_mode_t data_mode;
  MIR_reg_t hard_reg, reg;
  int out_p, call_p, addr_reload_p, rld_in_num;
  int out_mem_op_num, in_mem_op_num, other_mem_op_num;
  nops = MIR_insn_nops (ctx, insn);
  out_mem_op_num = in_mem_op_num = -1;
  rld_in_num = 0;
  /* Update live info, save/restore regs living across calls, and check do we need addr reload:
   */
  for (int niter = 0; niter <= 1; niter++) {
    for (i = 0; i < nops; i++) {
      op = &insn->ops[i];
      data_mode = MIR_insn_op_mode (ctx, insn, i, &out_p);
      if (niter == 0 && (!out_p || op->mode == MIR_OP_VAR_MEM)) continue;
      if (niter == 1 && (out_p && op->mode != MIR_OP_VAR_MEM)) continue;
      switch (op->mode) {
      case MIR_OP_VAR:
        if (op->u.var <= MAX_HARD_REG) {
          bitmap_set_bit_p (func_used_hard_regs, op->u.var);
          if (data != NULL) update_live (op->u.var, out_p, data->live);
        } else {
          if (!out_p && VARR_GET (MIR_reg_t, reg_renumber, op->u.var) > MAX_HARD_REG
              && mode2type (data_mode) == MIR_T_I64)
            rld_in_num++;
          if (data != NULL) {
            update_live (op->u.var, out_p, data->live);
            if (bitmap_clear_bit_p (data->regs_to_save, op->u.var)) /* put (slot<-hr) after insn */
              spill_restore_reg (gen_ctx, op->u.var, base_reg, insn, TRUE, FALSE);
          }
        }
        break;
      case MIR_OP_VAR_MEM:
        if (op->u.var_mem.base <= MAX_HARD_REG)
          bitmap_set_bit_p (func_used_hard_regs, op->u.var_mem.base);
        if (op->u.var_mem.index <= MAX_HARD_REG)
          bitmap_set_bit_p (func_used_hard_regs, op->u.var_mem.index);
        if (op->u.var_mem.base != MIR_NON_VAR && op->u.var_mem.index != MIR_NON_VAR
            && op->u.var_mem.base > MAX_HARD_REG && op->u.var_mem.index > MAX_HARD_REG
            && VARR_GET (MIR_reg_t, reg_renumber, op->u.var_mem.base) > MAX_HARD_REG
            && VARR_GET (MIR_reg_t, reg_renumber, op->u.var_mem.index) > MAX_HARD_REG) {
          other_mem_op_num = -1;
          if (out_p) {
            gen_assert (out_mem_op_num < 0);
            out_mem_op_num = (int) i;
            if (in_mem_op_num >= 0) other_mem_op_num = in_mem_op_num;
          } else {
            gen_assert (in_mem_op_num < 0);
            in_mem_op_num = (int) i;
            if (out_mem_op_num >= 0) other_mem_op_num = out_mem_op_num;
          }
          if (other_mem_op_num < 0
              || op->u.var_mem.base != insn->ops[other_mem_op_num].u.var_mem.base
              || op->u.var_mem.index != insn->ops[other_mem_op_num].u.var_mem.index)
            rld_in_num += 2;
        }
        if (data != NULL) {
          if (op->u.var_mem.base != MIR_NON_VAR) {
            update_live (op->u.var_mem.base, FALSE, data->live);
            if (op->u.var_mem.base > MAX_HARD_REG) {
              if (bitmap_clear_bit_p (data->regs_to_save,
                                      op->u.var_mem.base)) /* put slot<-hr after */
                spill_restore_reg (gen_ctx, op->u.var_mem.base, base_reg, insn, TRUE, FALSE);
            }
          }
          if (op->u.var_mem.index != MIR_NON_VAR) {
            update_live (op->u.var_mem.index, FALSE, data->live);
            if (op->u.var_mem.index > MAX_HARD_REG) {
              if (bitmap_clear_bit_p (data->regs_to_save,
                                      op->u.var_mem.index)) /* put slot<-hr after */
                spill_restore_reg (gen_ctx, op->u.var_mem.index, base_reg, insn, TRUE, FALSE);
            }
          }
        }
        break;
      default: /* do nothing */ break;
      }
    }
    if (data != NULL && niter == 0) { /* right after processing outputs */
      MIR_reg_t early_clobbered_hard_reg1, early_clobbered_hard_reg2;
      target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                            &early_clobbered_hard_reg2);
      if (early_clobbered_hard_reg1 != MIR_NON_VAR)
        update_live (early_clobbered_hard_reg1, TRUE, data->live);
      if (early_clobbered_hard_reg2 != MIR_NON_VAR)
        update_live (early_clobbered_hard_reg2, TRUE, data->live);
      if (MIR_call_code_p (insn->code)) {
        size_t nel;
        bb_insn_t bb_insn = insn->data;
        bitmap_iterator_t bi;
        FOREACH_BITMAP_BIT (bi, call_used_hard_regs[MIR_T_UNDEF], nel) {
          update_live ((MIR_reg_t) nel, TRUE, data->live);
        }
        FOREACH_BITMAP_BIT (bi, bb_insn->call_hard_reg_args, nel) {
          update_live ((MIR_reg_t) nel, FALSE, data->live);
        }
        FOREACH_BITMAP_BIT (bi, data->live, nel) {
          if (nel <= MAX_HARD_REG) continue;
          reg = (MIR_reg_t) nel;
          if (bitmap_bit_p (data->bb->spill_gen, reg)) continue; /* will be spilled in split */
          MIR_reg_t loc = VARR_GET (MIR_reg_t, reg_renumber, reg);
          if (loc > MAX_HARD_REG) continue;
          type = MIR_reg_type (gen_ctx->ctx, reg - MAX_HARD_REG, curr_func_item->u.func);
          int nregs = target_locs_num (loc, type);
          if (hreg_in_bitmap_p (loc, type, nregs, call_used_hard_regs[MIR_T_UNDEF])
              && bitmap_set_bit_p (data->regs_to_save, reg)) /* put (hr<-slot) after call */
            spill_restore_reg (gen_ctx, reg, base_reg, insn, TRUE, TRUE);
        }
      }
    }
  }
  addr_reload_p = rld_in_num > 2;
  out_reloads_num = in_reloads_num = 0;
  if (addr_reload_p) { /* not enough 2 temp int hard regs: address reload: */
    reload_addr (gen_ctx, insn, in_mem_op_num, out_mem_op_num, base_reg);
    get_reload_hreg (gen_ctx, MIR_NON_VAR, MIR_T_I64,
                     FALSE); /* reserve the 1st int temp hard reg */
  }
  if (MIR_addr_code_p (insn->code)) transform_addr (gen_ctx, insn, base_reg);
  call_p = MIR_call_code_p (insn->code);
  for (i = 0; i < nops; i++) {
    op = &insn->ops[i];
    data_mode = MIR_insn_op_mode (ctx, insn, i, &out_p);
    DEBUG (2, {
      if (out_p)
        out_op = *op; /* we don't care about multiple call outputs here */
      else
        in_op = *op;
    });
    switch (op->mode) {
    case MIR_OP_VAR:
      if (op->u.var <= MAX_HARD_REG) break;
      if (data_mode == MIR_OP_VAR) {
        gen_assert (insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1));
        type = MIR_reg_type (ctx, op->u.var - MAX_HARD_REG, curr_func_item->u.func);
        data_mode = type == MIR_T_F    ? MIR_OP_FLOAT
                    : type == MIR_T_D  ? MIR_OP_DOUBLE
                    : type == MIR_T_LD ? MIR_OP_LDOUBLE
                                       : MIR_OP_INT;
      }
      MIR_reg_t loc = VARR_GET (MIR_reg_t, reg_renumber, op->u.var);
      if (!MIR_addr_code_p (insn->code) && i == 0 && loc > MAX_HARD_REG
          && try_spilled_reg_mem (gen_ctx, insn, (int) i, loc, base_reg))
        break;
      hard_reg = change_reg (gen_ctx, &mem_op, op->u.var, base_reg, data_mode, insn, out_p);
      if (hard_reg == MIR_NON_VAR) { /* we don't use hard regs for this type reg (e.g. ldouble) */
        *op = mem_op;
      } else {
        op->u.var = hard_reg;
      }
      break;
    case MIR_OP_VAR_MEM:
      if (call_p && MIR_blk_type_p (op->u.var_mem.type)) break;
      if (op->u.var_mem.base > MAX_HARD_REG && op->u.var_mem.base != MIR_NON_VAR) {
        op->u.var_mem.base
          = change_reg (gen_ctx, &mem_op, op->u.var_mem.base, base_reg, MIR_OP_INT, insn, FALSE);
        gen_assert (op->u.var_mem.base != MIR_NON_VAR); /* we can always use GP regs */
      }
      if (op->u.var_mem.index > MAX_HARD_REG && op->u.var_mem.index != MIR_NON_VAR) {
        op->u.var_mem.index
          = change_reg (gen_ctx, &mem_op, op->u.var_mem.index, base_reg, MIR_OP_INT, insn, FALSE);
        gen_assert (op->u.var_mem.index != MIR_NON_VAR); /* we can always use GP regs */
      }
      break;
    default: /* do nothing */ break;
    }
  }
  if (move_code_p (insn->code)) {
    if (MIR_op_eq_p (ctx, insn->ops[0], insn->ops[1])) {
      DEBUG (2, {
        fprintf (debug_file, "Deleting noop move ");
        MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, FALSE);
        fprintf (debug_file, " which was ");
        insn->ops[0] = out_op;
        insn->ops[1] = in_op;
        MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, TRUE);
      });
      bb_insn_t bb_insn;
      if (optimize_level > 0 && (bb_insn = insn->data) != NULL
          && DLIST_HEAD (bb_insn_t, bb_insn->bb->bb_insns) == bb_insn
          && DLIST_TAIL (bb_insn_t, bb_insn->bb->bb_insns) == bb_insn) { /* avoid empty bb */
        MIR_insn_t nop = MIR_new_insn_arr (gen_ctx->ctx, MIR_USE, 0, NULL);
        MIR_insert_insn_before (gen_ctx->ctx, curr_func_item, bb_insn->insn, nop);
        add_new_bb_insn (gen_ctx, nop, bb_insn->bb, FALSE);
      }
      gen_delete_insn (gen_ctx, insn);
      return 1;
    }
  }
  return 0;
}